

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlDocPtr xmlCopyDoc(xmlDocPtr doc,int recursive)

{
  xmlDocPtr doc_00;
  char *pcVar1;
  xmlChar *pxVar2;
  xmlDtdPtr tree;
  xmlNsPtr pxVar3;
  xmlNodePtr pxVar4;
  _xmlNode *p_Var5;
  
  if (doc == (xmlDocPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  doc_00 = xmlNewDoc(doc->version);
  if (doc_00 == (xmlDocPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  doc_00->type = doc->type;
  if (doc->name != (char *)0x0) {
    pcVar1 = (*xmlMemStrdup)(doc->name);
    doc_00->name = pcVar1;
    if (pcVar1 == (char *)0x0) goto LAB_0014caff;
  }
  if (doc->encoding != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(doc->encoding);
    doc_00->encoding = pxVar2;
    if (pxVar2 == (xmlChar *)0x0) goto LAB_0014caff;
  }
  if (doc->URL != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(doc->URL);
    doc_00->URL = pxVar2;
    if (pxVar2 == (xmlChar *)0x0) goto LAB_0014caff;
  }
  doc_00->charset = doc->charset;
  doc_00->compression = doc->compression;
  doc_00->standalone = doc->standalone;
  if (recursive == 0) {
    return doc_00;
  }
  doc_00->children = (_xmlNode *)0x0;
  doc_00->last = (_xmlNode *)0x0;
  if (doc->intSubset != (xmlDtdPtr)0x0) {
    tree = xmlCopyDtd(doc->intSubset);
    doc_00->intSubset = tree;
    if (tree == (xmlDtdPtr)0x0) goto LAB_0014caff;
    xmlSetTreeDoc((xmlNodePtr)tree,doc_00);
  }
  if (doc->oldNs != (xmlNsPtr)0x0) {
    pxVar3 = xmlCopyNamespaceList(doc->oldNs);
    doc_00->oldNs = pxVar3;
    if (pxVar3 == (xmlNsPtr)0x0) goto LAB_0014caff;
  }
  if (doc->children == (xmlNodePtr)0x0) {
    return doc_00;
  }
  pxVar4 = xmlStaticCopyNodeList(doc->children,doc_00,(xmlNodePtr)doc_00);
  doc_00->children = pxVar4;
  if (pxVar4 != (xmlNodePtr)0x0) {
    doc_00->last = (_xmlNode *)0x0;
    for (p_Var5 = doc_00->children; p_Var5 != (_xmlNode *)0x0; p_Var5 = p_Var5->next) {
      if (p_Var5->next == (_xmlNode *)0x0) {
        doc_00->last = p_Var5;
      }
    }
    if (pxVar4 != (xmlNodePtr)0x0) {
      return doc_00;
    }
  }
LAB_0014caff:
  xmlFreeDoc(doc_00);
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCopyDoc(xmlDocPtr doc, int recursive) {
    xmlDocPtr ret;

    if (doc == NULL) return(NULL);
    ret = xmlNewDoc(doc->version);
    if (ret == NULL) return(NULL);
    ret->type = doc->type;
    if (doc->name != NULL) {
        ret->name = xmlMemStrdup(doc->name);
        if (ret->name == NULL)
            goto error;
    }
    if (doc->encoding != NULL) {
        ret->encoding = xmlStrdup(doc->encoding);
        if (ret->encoding == NULL)
            goto error;
    }
    if (doc->URL != NULL) {
        ret->URL = xmlStrdup(doc->URL);
        if (ret->URL == NULL)
            goto error;
    }
    ret->charset = doc->charset;
    ret->compression = doc->compression;
    ret->standalone = doc->standalone;
    if (!recursive) return(ret);

    ret->last = NULL;
    ret->children = NULL;
    if (doc->intSubset != NULL) {
        ret->intSubset = xmlCopyDtd(doc->intSubset);
	if (ret->intSubset == NULL)
            goto error;
        /* Can't fail on DTD */
	xmlSetTreeDoc((xmlNodePtr)ret->intSubset, ret);
    }
    if (doc->oldNs != NULL) {
        ret->oldNs = xmlCopyNamespaceList(doc->oldNs);
        if (ret->oldNs == NULL)
            goto error;
    }
    if (doc->children != NULL) {
	xmlNodePtr tmp;

	ret->children = xmlStaticCopyNodeList(doc->children, ret,
		                               (xmlNodePtr)ret);
        if (ret->children == NULL)
            goto error;
	ret->last = NULL;
	tmp = ret->children;
	while (tmp != NULL) {
	    if (tmp->next == NULL)
	        ret->last = tmp;
	    tmp = tmp->next;
	}
    }
    return(ret);

error:
    xmlFreeDoc(ret);
    return(NULL);
}